

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O2

bool __thiscall
sptk::MedianFilter::Get(MedianFilter *this,vector<double,_std::allocator<double>_> *output)

{
  bool bVar1;
  _Elt_pointer pvVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  uint uVar6;
  vector<double,_std::allocator<double>_> *input_vector;
  _Elt_pointer pvVar7;
  size_type sVar8;
  _Map_pointer ppvVar9;
  int n;
  ulong uVar10;
  long lVar11;
  _Elt_pointer pvVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  
  bVar5 = false;
  if ((output != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false, this->is_valid_ != false)) {
    bVar5 = Forward(this);
    if (bVar5) {
      uVar6 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
      if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)(int)uVar6) {
        std::vector<double,_std::allocator<double>_>::resize(output,(long)(int)uVar6);
      }
      uVar17 = 0;
      uVar18 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
        pvVar7 = (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pvVar12 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppvVar9 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pvVar2 = (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        bVar5 = this->apply_each_dimension_;
        uVar16 = 0;
        uVar13 = uVar17 & 0xffffffff;
        if ((bVar5 & 1U) == 0) {
          uVar13 = uVar16;
        }
        iVar14 = 0;
        while (pvVar7 != pvVar2) {
          bVar1 = this->use_magic_number_;
          pdVar3 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = uVar13;
          while( true ) {
            iVar15 = (int)uVar17;
            if ((bVar5 & 1U) == 0) {
              iVar15 = this->num_input_order_;
            }
            if ((long)iVar15 < (long)uVar10) break;
            pdVar4 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((bVar1 & 1U) == 0) {
              dVar19 = pdVar4[uVar10];
LAB_00104db2:
              iVar15 = (int)uVar16;
              uVar16 = (ulong)(iVar15 + 1);
              pdVar3[iVar15] = dVar19;
            }
            else {
              dVar19 = pdVar4[uVar10];
              if ((this->magic_number_ != dVar19) || (NAN(this->magic_number_) || NAN(dVar19)))
              goto LAB_00104db2;
              iVar14 = iVar14 + 1;
            }
            uVar10 = uVar10 + 1;
          }
          pvVar7 = pvVar7 + 1;
          if (pvVar7 == pvVar12) {
            pvVar7 = ppvVar9[1];
            ppvVar9 = ppvVar9 + 1;
            pvVar12 = pvVar7 + 0x15;
          }
        }
        iVar15 = (int)uVar16;
        if (iVar15 < iVar14) {
          dVar19 = this->magic_number_;
        }
        else {
          pdVar3 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = (long)(iVar15 / 2);
          std::
          __partial_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pdVar3,pdVar3 + lVar11 + 1,pdVar3 + iVar15);
          bVar5 = IsEven(iVar15);
          pdVar3 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (bVar5) {
            dVar19 = (pdVar3[lVar11 + -1] + pdVar3[lVar11]) * 0.5;
          }
          else {
            dVar19 = pdVar3[lVar11];
          }
        }
        (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] = dVar19;
      }
      iVar14 = this->num_filter_order_;
      if ((iVar14 / 2 <= this->count_down_) &&
         (sVar8 = std::
                  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size(&this->queue_), (int)sVar8 <= iVar14)) {
        return true;
      }
      std::
      deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::pop_front(&this->queue_);
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool MedianFilter::Get(std::vector<double>* output) {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  if (!Forward()) {
    return false;
  }

  const int output_size(GetSize());
  if (output->size() != static_cast<std::size_t>(output_size)) {
    output->resize(output_size);
  }

  for (int m(0); m < output_size; ++m) {
    int num_magic_numbers(0);
    int num_valid_numbers(0);
    for (const std::vector<double>& input_vector : queue_) {
      for (int n(apply_each_dimension_ ? m : 0);
           n <= (apply_each_dimension_ ? m : num_input_order_); ++n) {
        if (use_magic_number_ && magic_number_ == input_vector[n]) {
          ++num_magic_numbers;
        } else {
          flat_[num_valid_numbers++] = input_vector[n];
        }
      }
    }

    if (num_valid_numbers < num_magic_numbers) {
      (*output)[m] = magic_number_;
      continue;
    }

    const int half_size(num_valid_numbers / 2);
    std::partial_sort(flat_.begin(), flat_.begin() + half_size + 1,
                      flat_.begin() + num_valid_numbers);
    if (IsEven(num_valid_numbers)) {
      (*output)[m] = 0.5 * (flat_[half_size - 1] + flat_[half_size]);
    } else {
      (*output)[m] = flat_[half_size];
    }
  }

  if (count_down_ < num_filter_order_ / 2 ||
      num_filter_order_ + 1 <= static_cast<int>(queue_.size())) {
    queue_.pop_front();
  }

  return true;
}